

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_map(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
              AMQP_MAP_KEY_VALUE_PAIR *pairs)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  uint local_30;
  uint32_t elements;
  uint32_t size;
  int result;
  AMQP_MAP_KEY_VALUE_PAIR *pairs_local;
  void *pvStack_18;
  uint32_t count_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  _size = pairs;
  pairs_local._4_4_ = count;
  pvStack_18 = context;
  context_local = encoder_output;
  iVar1 = amqpvalue_get_encoded_map_size(pairs,count,&local_30);
  if (iVar1 == 0) {
    if ((count << 1 < 0x100) && (local_30 < 0xff)) {
      iVar1 = encode_map_constructor((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,true);
      if ((iVar1 == 0) &&
         (iVar1 = encode_map_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,
                                   pairs_local._4_4_,local_30,_size,true), iVar1 == 0)) {
        elements = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"encode_map",0x101b,1,"Could not encode small map");
        }
        elements = 0x101c;
      }
    }
    else {
      iVar1 = encode_map_constructor((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,false);
      if ((iVar1 == 0) &&
         (iVar1 = encode_map_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,
                                   pairs_local._4_4_,local_30,_size,false), iVar1 == 0)) {
        elements = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"encode_map",0x102b,1,"Could not encode large map");
        }
        elements = 0x102c;
      }
    }
  }
  else {
    elements = 0x1010;
  }
  return elements;
}

Assistant:

static int encode_map(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, AMQP_MAP_KEY_VALUE_PAIR* pairs)
{
    int result;
    uint32_t size;

    /* Codes_SRS_AMQPVALUE_01_124: [Map encodings MUST contain an even number of items (i.e. an equal number of keys and values).] */
    uint32_t elements = count * 2;

    if (amqpvalue_get_encoded_map_size(pairs, count, &size) != 0)
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        result = MU_FAILURE;
    }
    else
    {
        if ((elements <= 255) && (size < 255))
        {
            /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xc1" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
            if ((encode_map_constructor(encoder_output, context, true) != 0) ||
                (encode_map_value(encoder_output, context, count, size, pairs, true) != 0))
            {
                /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
                LogError("Could not encode small map");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
                result = 0;
            }
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xd1" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
            if ((encode_map_constructor(encoder_output, context, false) != 0) ||
                (encode_map_value(encoder_output, context, count, size, pairs, false) != 0))
            {
                /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
                LogError("Could not encode large map");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
                result = 0;
            }
        }
    }

    return result;
}